

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GetCentralDirectoryEntry
                (SyArchive *pArch,SyArchiveEntry *pEntry,uchar *zCentral,sxu32 *pNextOffset)

{
  sxi32 local_40;
  sxu32 local_3c;
  sxi32 rc;
  sxu32 nMagic;
  sxu16 nComment;
  sxu16 nDosTime;
  SyString *pSStack_30;
  sxu16 nDosDate;
  SyString *pName;
  sxu32 *pNextOffset_local;
  uchar *zCentral_local;
  SyArchiveEntry *pEntry_local;
  SyArchive *pArch_local;
  
  pSStack_30 = &pEntry->sFileName;
  rc._2_2_ = 0;
  local_3c = 0;
  nMagic = 0;
  pEntry_local = (SyArchiveEntry *)0x0;
  pName = (SyString *)pNextOffset;
  pNextOffset_local = (sxu32 *)zCentral;
  zCentral_local = (uchar *)pEntry;
  SyLittleEndianUnpack32(&local_3c,zCentral,4);
  if (local_3c == 0x2014b50) {
    SyLittleEndianUnpack16((sxu16 *)&pSStack_30->nByte,(uchar *)(pNextOffset_local + 7),2);
    if (pSStack_30->nByte < 0x8000) {
      SyLittleEndianUnpack16
                ((sxu16 *)(zCentral_local + 0x4e),(uchar *)((long)pNextOffset_local + 0x1e),2);
      SyLittleEndianUnpack16((sxu16 *)((long)&rc + 2),(uchar *)(pNextOffset_local + 8),2);
      SyLittleEndianUnpack16
                ((sxu16 *)(zCentral_local + 0x4c),(uchar *)((long)pNextOffset_local + 10),2);
      SyLittleEndianUnpack16((sxu16 *)&nMagic,(uchar *)(pNextOffset_local + 3),2);
      SyLittleEndianUnpack16
                ((sxu16 *)((long)&nMagic + 2),(uchar *)((long)pNextOffset_local + 0xe),2);
      SyDosTimeFormat(nMagic,(Sytm *)(zCentral_local + 0x10));
      *(int *)(zCentral_local + 0x20) = *(int *)(zCentral_local + 0x20) + -1;
      SyLittleEndianUnpack32((sxu32 *)(zCentral_local + 0xc),(uchar *)(pNextOffset_local + 4),4);
      SyLittleEndianUnpack32((sxu32 *)zCentral_local,(uchar *)(pNextOffset_local + 6),4);
      if (*(uint *)zCentral_local < 0x80000000) {
        SyLittleEndianUnpack32((sxu32 *)(zCentral_local + 4),(uchar *)(pNextOffset_local + 5),4);
        if (*(uint *)(zCentral_local + 4) < 0x80000000) {
          SyLittleEndianUnpack32
                    ((sxu32 *)(zCentral_local + 0x48),(uchar *)((long)pNextOffset_local + 0x2a),4);
          if (*(uint *)(zCentral_local + 0x48) < 0x80000000) {
            local_40 = 0;
          }
          else {
            local_40 = -0x20;
          }
        }
        else {
          local_40 = -0x20;
        }
      }
      else {
        local_40 = -0x20;
      }
    }
    else {
      local_40 = -0x20;
    }
  }
  else {
    local_40 = -0x18;
  }
  *(uint *)&pName->zString =
       pSStack_30->nByte + 0x2e + (uint)*(ushort *)(zCentral_local + 0x4e) + (uint)rc._2_2_;
  return local_40;
}

Assistant:

static sxi32 GetCentralDirectoryEntry(SyArchive *pArch, SyArchiveEntry *pEntry, const unsigned char *zCentral, sxu32 *pNextOffset)
 { 
 	SyString *pName = &pEntry->sFileName; /* File name */
 	sxu16 nDosDate, nDosTime;
	sxu16 nComment = 0 ;
	sxu32 nMagic = 0; /* cc -O6 warning */
	sxi32 rc; 	
	nDosDate = nDosTime = 0; /* cc -O6 warning */
	SXUNUSED(pArch);
 	/* Sanity check */
 	rc = SyLittleEndianUnpack32(&nMagic, zCentral, sizeof(sxu32));
 	if( /* rc != SXRET_OK || */ nMagic != SXZIP_CENTRAL_MAGIC ){
 		rc = SXERR_CORRUPT; 		
 		/*
 		 * Try to recover by examing the next central directory record.
 		 * Dont worry here, there is no risk of an infinite loop since
		 * the buffer size is delimited.
 		 */

 		/* pName->nByte = 0; nComment = 0; pName->nExtra = 0 */
 		goto update;
 	}
 	/*
 	 * entry name length
 	 */
 	SyLittleEndianUnpack16((sxu16 *)&pName->nByte, &zCentral[28], sizeof(sxu16));
 	if( pName->nByte > SXI16_HIGH /* SXU16_HIGH */){
 		 rc = SXERR_BIG;
 		 goto update;
 	}
 	/* Extra information */
 	SyLittleEndianUnpack16(&pEntry->nExtra, &zCentral[30], sizeof(sxu16));
 	/* Comment length  */
 	SyLittleEndianUnpack16(&nComment, &zCentral[32], sizeof(sxu16)); 	
 	/* Compression method 0 == stored / 8 == deflated */
 	rc = SyLittleEndianUnpack16(&pEntry->nComprMeth, &zCentral[10], sizeof(sxu16));
 	/* DOS Timestamp */
 	SyLittleEndianUnpack16(&nDosTime, &zCentral[12], sizeof(sxu16));
 	SyLittleEndianUnpack16(&nDosDate, &zCentral[14], sizeof(sxu16));
 	SyDosTimeFormat((nDosDate << 16 | nDosTime), &pEntry->sFmt);
	/* Little hack to fix month index  */
	pEntry->sFmt.tm_mon--;
 	/* CRC32 */
 	rc = SyLittleEndianUnpack32(&pEntry->nCrc, &zCentral[16], sizeof(sxu32));
 	/* Content size before compression */
 	rc = SyLittleEndianUnpack32(&pEntry->nByte, &zCentral[24], sizeof(sxu32));
 	if(  pEntry->nByte > SXI32_HIGH ){
 		rc = SXERR_BIG;
 		goto update; 
 	} 	
 	/*
 	 * Content size after compression.
 	 * Note that if the file is stored pEntry->nByte should be equal to pEntry->nByteCompr
 	 */ 
 	rc = SyLittleEndianUnpack32(&pEntry->nByteCompr, &zCentral[20], sizeof(sxu32));
 	if( pEntry->nByteCompr > SXI32_HIGH ){
 		rc = SXERR_BIG;
 		goto update; 
 	} 	 	
 	/* Finally grab the contents offset */
 	SyLittleEndianUnpack32(&pEntry->nOfft, &zCentral[42], sizeof(sxu32));
 	if( pEntry->nOfft > SXI32_HIGH ){
 		rc = SXERR_BIG;
 		goto update;
 	} 	
  	 rc = SXRET_OK;
update:	  
 	/* Update the offset to point to the next central directory record */
 	*pNextOffset =  SXZIP_CENTRAL_HDRSZ + pName->nByte + pEntry->nExtra + nComment;
 	return rc; /* Report failure or success */
}